

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

void __thiscall siamese::EncoderPacketWindow::RemoveElements(EncoderPacketWindow *this)

{
  ostringstream *this_00;
  uint uVar1;
  EncoderSubwindow **ppEVar2;
  bool bVar3;
  uint count;
  uint uVar4;
  OutputWorker *this_01;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint sumIndex;
  uint uVar8;
  long lVar9;
  EncoderColumnLane *pEVar10;
  uint uVar11;
  uint laneIndex;
  long lVar12;
  uint laneLongest [8];
  LogStringBuffer local_1b8;
  
  uVar6 = this->FirstUnremovedElement;
  if (DAT_001ff848 < 3) {
    this_00 = &local_1b8.LogStream;
    local_1b8.ChannelName = Logger;
    local_1b8.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&DAT_001ff878);
    std::operator<<((ostream *)this_00,"******** Removing up to ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," and startColumn=");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  uVar11 = uVar6 >> 6;
  uVar6 = uVar6 & 0xffffffc0;
  if (this->SumStartElement < this->SumEndElement) {
    pEVar10 = this->Lanes;
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        GetSum(this,(uint)lVar12,(uint)lVar9,uVar6);
        pEVar10->NextElement[lVar9] = pEVar10->NextElement[lVar9] - uVar6;
      }
      pEVar10 = pEVar10 + 1;
    }
    uVar8 = this->SumStartElement;
    if (uVar8 <= uVar6 && uVar6 - uVar8 != 0) {
      this->SumErasedCount = this->SumErasedCount + (uVar6 - uVar8);
    }
    uVar7 = this->SumEndElement - uVar6;
    if (this->SumEndElement < uVar6) {
      uVar7 = 0;
    }
    uVar4 = uVar8 - uVar6;
    if (uVar8 < uVar6) {
      uVar4 = 0;
    }
    this->SumEndElement = uVar7;
    this->SumStartElement = uVar4;
  }
  bVar3 = pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_NoCopy
                    (&this->SubwindowsShift,uVar11);
  if (bVar3) {
    memcpy((this->SubwindowsShift).DataPtr,(this->Subwindows).DataPtr,(ulong)(uVar11 * 8));
    ppEVar2 = (this->Subwindows).DataPtr;
    uVar8 = (this->Subwindows).Size - uVar11;
    memmove(ppEVar2,ppEVar2 + uVar11,(ulong)uVar8 * 8);
    memcpy((this->Subwindows).DataPtr + (int)uVar8,(this->SubwindowsShift).DataPtr,
           (ulong)(uVar11 * 8));
    uVar11 = 0;
    uVar8 = this->Count - uVar6;
    uVar7 = this->FirstUnremovedElement - uVar6;
    this->Count = uVar8;
    this->ColumnStart = uVar6 + this->ColumnStart & 0x3fffff;
    this->FirstUnremovedElement = uVar7;
    local_1b8.ChannelName = (char *)0x0;
    local_1b8.LogLevel = Trace;
    local_1b8._12_4_ = 0;
    local_1b8.LogStream = (ostringstream)0x0;
    local_1b8._17_7_ = 0;
    local_1b8._24_8_ = 0;
    ppEVar2 = (this->Subwindows).DataPtr;
    for (uVar6 = uVar7; uVar6 < uVar8; uVar6 = uVar6 + 1) {
      uVar4 = (ppEVar2[uVar6 >> 6]->Originals)._M_elems[uVar6 & 0x3f].Buffer.Bytes;
      if (uVar11 <= uVar4) {
        uVar11 = uVar4;
      }
      uVar1 = *(uint *)((long)&local_1b8.ChannelName + (ulong)(uVar6 & 7) * 4);
      if (uVar4 < uVar1) {
        uVar4 = uVar1;
      }
      *(uint *)((long)&local_1b8.ChannelName + (ulong)(uVar6 & 7) * 4) = uVar4;
    }
    puVar5 = &this->Lanes[0].LongestPacket;
    this->LongestPacket = uVar11;
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      *puVar5 = *(uint *)((long)&local_1b8.ChannelName + lVar12 * 4);
      puVar5 = puVar5 + 0x12;
    }
    if (this->SumEndElement <= this->SumStartElement) {
      ResetSums(this,uVar7);
    }
  }
  else {
    this->EmergencyDisabled = true;
  }
  return;
}

Assistant:

void EncoderPacketWindow::RemoveElements()
{
    const unsigned firstKeptSubwindow  = FirstUnremovedElement / kSubwindowSize;
    const unsigned removedElementCount = firstKeptSubwindow * kSubwindowSize;
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow >= 1);
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow < Subwindows.GetSize());
    SIAMESE_DEBUG_ASSERT(removedElementCount % kColumnLaneCount == 0);
    SIAMESE_DEBUG_ASSERT(removedElementCount <= FirstUnremovedElement);

    Logger.Info("******** Removing up to ", FirstUnremovedElement, " and startColumn=", ColumnStart);

    // If there are running sums:
    if (SumEndElement > SumStartElement)
    {
        // Roll up the sums past the removal point
        for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
        {
            for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
            {
                GetSum(laneIndex, sumIndex, removedElementCount);

                SIAMESE_DEBUG_ASSERT(Lanes[laneIndex].NextElement[sumIndex] >= removedElementCount);
                Lanes[laneIndex].NextElement[sumIndex] -= removedElementCount;
            }
        }

        if (removedElementCount > SumStartElement) {
            SumErasedCount += removedElementCount - SumStartElement;
        }

        if (SumEndElement > removedElementCount) {
            SumEndElement -= removedElementCount;
        }
        else {
            SumEndElement = 0;
        }

        if (SumStartElement > removedElementCount) {
            SumStartElement -= removedElementCount;
        }
        else {
            SumStartElement = 0;
        }
    }

    // Shift kept subwindows to the front of the vector:

    // Resize a temporary buffer for removed subwindows
    if (!SubwindowsShift.SetSize_NoCopy(firstKeptSubwindow))
    {
        SIAMESE_DEBUG_BREAK(); // OOM
        EmergencyDisabled = true;
        return;
    }

    // Store removed subwindows temporarily
    memcpy(
        SubwindowsShift.GetPtr(0),
        Subwindows.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    const unsigned subwindowsShifted = Subwindows.GetSize() - firstKeptSubwindow;

    // Shift subwindows to front that are being kept
    memmove(
        Subwindows.GetPtr(0),
        Subwindows.GetPtr(firstKeptSubwindow),
        subwindowsShifted * sizeof(EncoderSubwindow*)
    );

    // Removed subwindows are moved to the end (unordered) for later reuse
    memcpy(
        Subwindows.GetPtr(subwindowsShifted),
        SubwindowsShift.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    // Update the count of elements in the window
    SIAMESE_DEBUG_ASSERT(Count >= removedElementCount);
    Count -= removedElementCount;

    // Roll up the ColumnStart member
    ColumnStart = ElementToColumn(removedElementCount);
    SIAMESE_DEBUG_ASSERT(ColumnStart == Subwindows.GetRef(0)->Originals[0].Column);

    // Roll up the FirstUnremovedElement member
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement % kSubwindowSize == FirstUnremovedElement - removedElementCount);
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement >= removedElementCount);
    FirstUnremovedElement -= removedElementCount;

    // Determine the new longest packets
    unsigned longestPacket = 0;
    unsigned laneLongest[kColumnLaneCount] = { 0 };
    for (unsigned i = FirstUnremovedElement, count = Count; i < count; ++i)
    {
        OriginalPacket* original     = GetWindowElement(i);
        const unsigned originalBytes = original->Buffer.Bytes;
        if (longestPacket < originalBytes) {
            longestPacket = originalBytes;
        }
        SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == i % kColumnLaneCount);
        const unsigned laneIndex = i % kColumnLaneCount;
        if (laneLongest[laneIndex] < originalBytes) {
            laneLongest[laneIndex] = originalBytes;
        }
    }

    // Update longest packet fields
    LongestPacket = longestPacket;
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex) {
        Lanes[laneIndex].LongestPacket = laneLongest[laneIndex];
    }

    // If there are no running sums:
    if (SumEndElement <= SumStartElement) {
        ResetSums(FirstUnremovedElement);
    }
}